

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O2

void __thiscall TApp_RangeDouble_Test::TestBody(TApp_RangeDouble_Test *this)

{
  App *this_00;
  input_t *piVar1;
  bool bVar2;
  Option *pOVar3;
  AssertHelper AStack_b8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0 [4];
  double x;
  string local_88;
  string local_68;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  x = 0.0;
  std::__cxx11::string::string((string *)&local_68,"--one",(allocator *)local_b0);
  std::__cxx11::string::string((string *)&local_88,"",(allocator *)&AStack_b8);
  this_00 = &(this->super_TApp).app;
  pOVar3 = CLI::App::add_option<double,_(CLI::detail::enabler)0>(this_00,&local_68,&x,&local_88);
  local_48._M_unused._M_object = (void *)0x4008000000000000;
  local_48._8_8_ = 0x4018000000000000;
  local_30 = CLI::std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/include/CLI/Validators.hpp:65:12)>
             ::_M_invoke;
  local_38 = CLI::std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/include/CLI/Validators.hpp:65:12)>
             ::_M_manager;
  std::
  vector<std::function<std::__cxx11::string(std::__cxx11::string&)>,std::allocator<std::function<std::__cxx11::string(std::__cxx11::string&)>>>
  ::emplace_back<std::function<std::__cxx11::string(std::__cxx11::string_const&)>&>
            ((vector<std::function<std::__cxx11::string(std::__cxx11::string&)>,std::allocator<std::function<std::__cxx11::string(std::__cxx11::string&)>>>
              *)&pOVar3->validators_,
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&local_48);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_48);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string((string *)local_b0,"--one=1",(allocator *)&AStack_b8);
  piVar1 = &(this->super_TApp).args;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,local_b0,&x
            );
  std::__cxx11::string::~string((string *)local_b0);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    TApp::run(&this->super_TApp);
  }
  testing::Message::Message((Message *)local_b0);
  testing::internal::AssertHelper::AssertHelper
            (&AStack_b8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x4b6,
             "Expected: run() throws an exception of type CLI::ValidationError.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&AStack_b8,(Message *)local_b0);
  testing::internal::AssertHelper::~AssertHelper(&AStack_b8);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(local_b0);
  CLI::App::reset(this_00);
  std::__cxx11::string::string((string *)local_b0,"--one=7",(allocator *)&AStack_b8);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,local_b0,&x
            );
  std::__cxx11::string::~string((string *)local_b0);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    TApp::run(&this->super_TApp);
  }
  testing::Message::Message((Message *)local_b0);
  testing::internal::AssertHelper::AssertHelper
            (&AStack_b8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x4ba,
             "Expected: run() throws an exception of type CLI::ValidationError.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&AStack_b8,(Message *)local_b0);
  testing::internal::AssertHelper::~AssertHelper(&AStack_b8);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(local_b0);
  CLI::App::reset(this_00);
  std::__cxx11::string::string((string *)local_b0,"--one=3",(allocator *)&AStack_b8);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,local_b0,&x
            );
  std::__cxx11::string::~string((string *)local_b0);
  TApp::run(&this->super_TApp);
  CLI::App::reset(this_00);
  std::__cxx11::string::string((string *)local_b0,"--one=5",(allocator *)&AStack_b8);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,local_b0,&x
            );
  std::__cxx11::string::~string((string *)local_b0);
  TApp::run(&this->super_TApp);
  CLI::App::reset(this_00);
  std::__cxx11::string::string((string *)local_b0,"--one=6",(allocator *)&AStack_b8);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,local_b0,&x
            );
  std::__cxx11::string::~string((string *)local_b0);
  TApp::run(&this->super_TApp);
  return;
}

Assistant:

TEST_F(TApp, RangeDouble) {

    double x = 0;
    /// Note that this must be a double in Range, too
    app.add_option("--one", x)->check(CLI::Range(3.0, 6.0));

    args = {"--one=1"};
    EXPECT_THROW(run(), CLI::ValidationError);

    app.reset();
    args = {"--one=7"};
    EXPECT_THROW(run(), CLI::ValidationError);

    app.reset();
    args = {"--one=3"};
    run();

    app.reset();
    args = {"--one=5"};
    run();

    app.reset();
    args = {"--one=6"};
    run();
}